

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_circularbuffer.h
# Opt level: O2

ssize_t __thiscall
PodCircularBuffer<char>::read(PodCircularBuffer<char> *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  int iVar2;
  ulong __n;
  undefined4 in_register_00000034;
  void *__dest;
  long lVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  
  __dest = (void *)CONCAT44(in_register_00000034,__fd);
  __n = 0;
  iVar2 = (int)__buf;
  if ((0 < iVar2) && (this->m_bEmpty == false)) {
    __n = (ulong)__buf & 0xffffffff;
    this->m_bFull = false;
    iVar5 = this->m_nReadPos;
    lVar3 = (long)iVar5;
    iVar4 = this->m_nWritePos;
    if (iVar4 == iVar5) {
      sVar6 = this->m_nBufSize - lVar3;
      iVar5 = (int)sVar6;
      if (iVar2 < iVar5) {
        memcpy(__dest,this->m_pBuf + lVar3,__n);
        iVar2 = this->m_nReadPos + iVar2;
        this->m_nReadPos = iVar2;
        this->m_bEmpty = iVar2 == this->m_nWritePos;
      }
      else {
        memcpy(__dest,this->m_pBuf + lVar3,sVar6);
        iVar4 = iVar2 - iVar5;
        if (this->m_nWritePos < iVar2 - iVar5) {
          iVar4 = this->m_nWritePos;
        }
        this->m_nReadPos = iVar4;
        memcpy((void *)((long)__dest + sVar6),this->m_pBuf,(long)iVar4);
        this->m_bEmpty = this->m_nReadPos == this->m_nWritePos;
        __n = (ulong)(uint)(iVar5 + this->m_nReadPos);
      }
    }
    else if (iVar5 < iVar4) {
      uVar1 = (ulong)(uint)(iVar4 - iVar5);
      if (iVar2 <= iVar4 - iVar5) {
        uVar1 = __n;
      }
      __n = uVar1;
      memcpy(__dest,this->m_pBuf + lVar3,(long)(int)__n);
      iVar2 = (int)__n + this->m_nReadPos;
      this->m_nReadPos = iVar2;
      this->m_bEmpty = iVar2 == this->m_nWritePos;
      if (this->m_nBufSize < iVar2) {
        __assert_fail("m_nReadPos <= m_nBufSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/pod_circularbuffer.h"
                      ,0xbd,"int PodCircularBuffer<char>::read(T *, int) [T = char]");
      }
      if (this->m_nBufSize < this->m_nWritePos) {
        __assert_fail("m_nWritePos <= m_nBufSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/pod_circularbuffer.h"
                      ,0xbe,"int PodCircularBuffer<char>::read(T *, int) [T = char]");
      }
    }
    else {
      sVar6 = this->m_nBufSize - lVar3;
      iVar5 = (int)sVar6;
      if (iVar2 < iVar5) {
        memcpy(__dest,this->m_pBuf + lVar3,__n);
        iVar2 = this->m_nReadPos + iVar2;
        this->m_nReadPos = iVar2;
        this->m_bEmpty = iVar2 == this->m_nWritePos;
        if (this->m_nBufSize < iVar2) {
          __assert_fail("m_nReadPos <= m_nBufSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/pod_circularbuffer.h"
                        ,0xcc,"int PodCircularBuffer<char>::read(T *, int) [T = char]");
        }
        if (this->m_nBufSize < this->m_nWritePos) {
          __assert_fail("m_nWritePos <= m_nBufSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/pod_circularbuffer.h"
                        ,0xcd,"int PodCircularBuffer<char>::read(T *, int) [T = char]");
        }
      }
      else {
        memcpy(__dest,this->m_pBuf + lVar3,sVar6);
        iVar4 = iVar2 - iVar5;
        if (this->m_nWritePos < iVar2 - iVar5) {
          iVar4 = this->m_nWritePos;
        }
        this->m_nReadPos = iVar4;
        memcpy((void *)((long)__dest + sVar6),this->m_pBuf,(long)iVar4);
        iVar2 = this->m_nReadPos;
        this->m_bEmpty = iVar2 == this->m_nWritePos;
        if (this->m_nBufSize < iVar2) {
          __assert_fail("m_nReadPos <= m_nBufSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/pod_circularbuffer.h"
                        ,0xd4,"int PodCircularBuffer<char>::read(T *, int) [T = char]");
        }
        if (this->m_nBufSize < this->m_nWritePos) {
          __assert_fail("m_nWritePos <= m_nBufSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/wqvbjhc[P]libuv_tcp/pod_circularbuffer.h"
                        ,0xd5,"int PodCircularBuffer<char>::read(T *, int) [T = char]");
        }
        __n = (ulong)(uint)(iVar2 + iVar5);
      }
    }
  }
  return __n;
}

Assistant:

int read(T* buf, int count) {
        if(count <= 0) {
            return 0;
        }
        if(m_bEmpty) {// 缓冲区空，不能继续读取数据
            return 0;
        }
        m_bFull = false;
        if(m_nReadPos == m_nWritePos) { // 缓冲区满时
            /*                          == 内存模型 ==
             (data)          m_nReadPos                (data)
            |--------------------------------|--------------------------------------------|
              m_nWritePos         m_nBufSize
            */
            int leftcount = m_nBufSize - m_nReadPos;
            if(leftcount > count) {
                memcpy(buf, &m_pBuf[m_nReadPos], count * sizeof(T));
                m_nReadPos += count;
                m_bEmpty = (m_nReadPos == m_nWritePos);
                return count;
            } else {
                memcpy(buf, &m_pBuf[m_nReadPos], leftcount * sizeof(T));
                m_nReadPos = (m_nWritePos > count - leftcount) ? count - leftcount : m_nWritePos;
                memcpy(&buf[leftcount], m_pBuf, m_nReadPos * sizeof(T));
                m_bEmpty = (m_nReadPos == m_nWritePos);
                return leftcount + m_nReadPos;
            }
        } else if(m_nReadPos < m_nWritePos) { // 写指针在前(未读数据是连接的)
            /*                          == 内存模型 ==
             (read)                 (unread)                      (read)
            |-------------------|----------------------------|---------------------------|
               m_nReadPos                m_nWritePos                     m_nBufSize
            */
            int leftcount = m_nWritePos - m_nReadPos;
            int c = (leftcount > count) ? count : leftcount;
            memcpy(buf, &m_pBuf[m_nReadPos], c * sizeof(T));
            m_nReadPos += c;
            m_bEmpty = (m_nReadPos == m_nWritePos);
            assert(m_nReadPos <= m_nBufSize);
            assert(m_nWritePos <= m_nBufSize);
            return c;
        } else {      // 读指针在前(未读数据可能是不连接的)
            /*                          == 内存模型 ==
               (unread)                (read)                      (unread)
            |-------------------|----------------------------|---------------------------|
                m_nWritePos                  m_nReadPos                  m_nBufSize

            */
            int leftcount = m_nBufSize - m_nReadPos;
            if(leftcount > count) { // 未读缓冲区够大，直接读取数据
                memcpy(buf, &m_pBuf[m_nReadPos], count * sizeof(T));
                m_nReadPos += count;
                m_bEmpty = (m_nReadPos == m_nWritePos);
                assert(m_nReadPos <= m_nBufSize);
                assert(m_nWritePos <= m_nBufSize);
                return count;
            } else {   // 未读缓冲区不足，需回到缓冲区头开始读
                memcpy(buf, &m_pBuf[m_nReadPos], leftcount * sizeof(T));
                m_nReadPos = (m_nWritePos >= count - leftcount) ? count - leftcount : m_nWritePos;
                memcpy(&buf[leftcount], m_pBuf, m_nReadPos * sizeof(T));
                m_bEmpty = (m_nReadPos == m_nWritePos);
                assert(m_nReadPos <= m_nBufSize);
                assert(m_nWritePos <= m_nBufSize);
                return leftcount + m_nReadPos;
            }
        }
    }